

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6850.cpp
# Opt level: O1

void __thiscall
Motorola::ACIA::ACIA::ACIA(ACIA *this,HalfCycles transmit_clock_rate,HalfCycles receive_clock_rate)

{
  (this->super_Source).observer_ = (Observer *)0x0;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_00597648;
  (this->super_ReadDelegate)._vptr_ReadDelegate = (_func_int **)&DAT_00597668;
  (this->receive).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->receive).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->receive).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->receive).remaining_delays_ = 0;
  (this->receive).transmission_extra_ = 0;
  (this->receive).level_ = true;
  (this->receive).clock_rate_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->receive).read_delegate_ = (ReadDelegate *)0x0;
  (this->receive).read_delegate_bit_length_.length = 0;
  *(undefined8 *)&(this->receive).read_delegate_bit_length_.clock_rate = 1;
  (this->receive).time_left_in_bit_.clock_rate = 1;
  (this->receive).write_cycles_since_delegate_call_ = 0;
  (this->receive).read_delegate_phase_ = WaitingForZero;
  (this->clear_to_send).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clear_to_send).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clear_to_send).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clear_to_send).remaining_delays_ = 0;
  (this->clear_to_send).transmission_extra_ = 0;
  (this->clear_to_send).level_ = true;
  (this->clear_to_send).read_delegate_bit_length_.length = 0;
  (this->clear_to_send).clock_rate_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->clear_to_send).read_delegate_ = (ReadDelegate *)0x0;
  *(undefined8 *)&(this->clear_to_send).read_delegate_bit_length_.clock_rate = 1;
  (this->clear_to_send).time_left_in_bit_.clock_rate = 1;
  (this->clear_to_send).write_cycles_since_delegate_call_ = 0;
  (this->clear_to_send).read_delegate_phase_ = WaitingForZero;
  (this->data_carrier_detect).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_carrier_detect).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_carrier_detect).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_carrier_detect).remaining_delays_ = 0;
  (this->data_carrier_detect).transmission_extra_ = 0;
  (this->data_carrier_detect).level_ = true;
  (this->data_carrier_detect).clock_rate_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->data_carrier_detect).read_delegate_ = (ReadDelegate *)0x0;
  (this->data_carrier_detect).read_delegate_bit_length_.length = 0;
  *(undefined8 *)&(this->data_carrier_detect).read_delegate_bit_length_.clock_rate = 1;
  (this->data_carrier_detect).time_left_in_bit_.clock_rate = 1;
  (this->data_carrier_detect).write_cycles_since_delegate_call_ = 0;
  (this->data_carrier_detect).read_delegate_phase_ = WaitingForZero;
  (this->transmit).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transmit).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transmit).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transmit).remaining_delays_ = 0;
  (this->transmit).transmission_extra_ = 0;
  (this->transmit).level_ = true;
  (this->transmit).clock_rate_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->transmit).read_delegate_ = (ReadDelegate *)0x0;
  (this->transmit).read_delegate_bit_length_.length = 0;
  *(undefined8 *)&(this->transmit).read_delegate_bit_length_.clock_rate = 1;
  (this->transmit).time_left_in_bit_.clock_rate = 1;
  (this->request_to_send).remaining_delays_ = 0;
  (this->request_to_send).transmission_extra_ = 0;
  (this->request_to_send).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->request_to_send).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transmit).write_cycles_since_delegate_call_ = 0;
  (this->transmit).read_delegate_phase_ = WaitingForZero;
  (this->request_to_send).events_.
  super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->request_to_send).level_ = true;
  (this->request_to_send).read_delegate_bit_length_.length = 0;
  (this->request_to_send).clock_rate_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->request_to_send).read_delegate_ = (ReadDelegate *)0x0;
  *(undefined8 *)&(this->request_to_send).read_delegate_bit_length_.clock_rate = 1;
  *(undefined8 *)&(this->request_to_send).time_left_in_bit_.clock_rate = 1;
  *(undefined8 *)&(this->request_to_send).read_delegate_phase_ = 0x100000000;
  this->parity_ = None;
  this->data_bits_ = 7;
  this->stop_bits_ = 2;
  this->next_transmission_ = 0x100;
  this->received_data_ = 0x100;
  *(undefined4 *)((long)&this->bits_incoming_ + 3) = 0;
  this->bits_received_ = 0;
  this->bits_incoming_ = 0;
  if (receive_clock_rate.super_WrappedInt<HalfCycles>.length_ == 0) {
    receive_clock_rate.super_WrappedInt<HalfCycles>.length_ =
         transmit_clock_rate.super_WrappedInt<HalfCycles>.length_;
  }
  (this->transmit_clock_rate_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)transmit_clock_rate.super_WrappedInt<HalfCycles>.length_;
  (this->receive_clock_rate_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)receive_clock_rate.super_WrappedInt<HalfCycles>.length_;
  this->interrupt_line_ = false;
  this->interrupt_delegate_ = (InterruptDelegate *)0x0;
  Serial::Line<false>::set_writer_clock_rate(&this->transmit,transmit_clock_rate);
  Serial::Line<false>::set_writer_clock_rate(&this->request_to_send,transmit_clock_rate);
  return;
}

Assistant:

ACIA::ACIA(HalfCycles transmit_clock_rate, HalfCycles receive_clock_rate) :
	transmit_clock_rate_(transmit_clock_rate),
	receive_clock_rate_((receive_clock_rate != SameAsTransmit) ? receive_clock_rate : transmit_clock_rate) {
	transmit.set_writer_clock_rate(transmit_clock_rate);
	request_to_send.set_writer_clock_rate(transmit_clock_rate);
}